

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O1

void __thiscall DPusher::ChangeValues(DPusher *this,int magnitude,int angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = (double)magnitude;
  dVar1 = FFastTrig::cos(&fasttrig,(double)angle * 1.40625 * 11930464.711111112 + 6755399441055744.0
                        );
  dVar2 = FFastTrig::sin(&fasttrig,dVar1 * dVar3);
  (this->m_PushVec).Y = dVar2 * dVar3;
  (this->m_PushVec).X = dVar1 * dVar3;
  this->m_Magnitude = dVar3;
  return;
}

Assistant:

void ChangeValues (int magnitude, int angle)
	{
		DAngle ang = angle * (360. / 256.);
		m_PushVec = ang.ToVector(magnitude);
		m_Magnitude = magnitude;
	}